

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::MakeConnection(SocketWriter *this)

{
  addrinfo *paVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  addrinfo **__pai;
  GTestLog local_64;
  addrinfo *servinfo;
  addrinfo local_58;
  
  if (this->sockfd_ != -1) {
    GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/src/gtest.cc"
                       ,0x131d);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Condition sockfd_ == -1 failed. ");
    std::operator<<(poVar3,"MakeConnection() can\'t be called when there is already a connection.");
    GTestLog::~GTestLog((GTestLog *)&local_58);
  }
  local_58.ai_flags = 0;
  local_58.ai_family = 0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  __pai = (addrinfo **)&servinfo;
  servinfo = (addrinfo *)0x0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_socktype = 1;
  local_58.ai_protocol = 0;
  iVar2 = getaddrinfo((this->host_name_)._M_dataplus._M_p,(this->port_num_)._M_dataplus._M_p,
                      &local_58,__pai);
  if (iVar2 != 0) {
    GTestLog::GTestLog(&local_64,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/src/gtest.cc"
                       ,0x132b);
    poVar3 = std::operator<<((ostream *)&std::cerr,"stream_result_to: getaddrinfo() failed: ");
    pcVar4 = gai_strerror(iVar2);
    std::operator<<(poVar3,pcVar4);
    GTestLog::~GTestLog(&local_64);
  }
  while ((this->sockfd_ == -1 && (paVar1 = *__pai, paVar1 != (addrinfo *)0x0))) {
    iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    this->sockfd_ = iVar2;
    if (iVar2 != -1) {
      iVar2 = connect(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
      if (iVar2 == -1) {
        close(this->sockfd_);
        this->sockfd_ = -1;
      }
    }
    __pai = &paVar1->ai_next;
  }
  freeaddrinfo((addrinfo *)servinfo);
  if (this->sockfd_ == -1) {
    GTestLog::GTestLog(&local_64,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/src/gtest.cc"
                       ,0x1340);
    poVar3 = std::operator<<((ostream *)&std::cerr,"stream_result_to: failed to connect to ");
    poVar3 = std::operator<<(poVar3,(string *)&this->host_name_);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&this->port_num_);
    GTestLog::~GTestLog(&local_64);
  }
  return;
}

Assistant:

void StreamingListener::SocketWriter::MakeConnection() {
  GTEST_CHECK_(sockfd_ == -1)
      << "MakeConnection() can't be called when there is already a connection.";

  addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_UNSPEC;    // To allow both IPv4 and IPv6 addresses.
  hints.ai_socktype = SOCK_STREAM;
  addrinfo* servinfo = nullptr;

  // Use the getaddrinfo() to get a linked list of IP addresses for
  // the given host name.
  const int error_num = getaddrinfo(
      host_name_.c_str(), port_num_.c_str(), &hints, &servinfo);
  if (error_num != 0) {
    GTEST_LOG_(WARNING) << "stream_result_to: getaddrinfo() failed: "
                        << gai_strerror(error_num);
  }

  // Loop through all the results and connect to the first we can.
  for (addrinfo* cur_addr = servinfo; sockfd_ == -1 && cur_addr != nullptr;
       cur_addr = cur_addr->ai_next) {
    sockfd_ = socket(
        cur_addr->ai_family, cur_addr->ai_socktype, cur_addr->ai_protocol);
    if (sockfd_ != -1) {
      // Connect the client socket to the server socket.
      if (connect(sockfd_, cur_addr->ai_addr, cur_addr->ai_addrlen) == -1) {
        close(sockfd_);
        sockfd_ = -1;
      }
    }
  }

  freeaddrinfo(servinfo);  // all done with this structure

  if (sockfd_ == -1) {
    GTEST_LOG_(WARNING) << "stream_result_to: failed to connect to "
                        << host_name_ << ":" << port_num_;
  }
}